

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::TransmitByteAsync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  bool bVar1;
  U8 UVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  uint local_20;
  U8 byte;
  bool abortThisByte;
  U32 i;
  bool abortFrame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  HdlcSimulationDataGenerator *this_local;
  
  CreateAsyncByte(this,'~');
  bVar1 = ContainsElement(this,this->mFrameNumber);
  local_20 = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(stream);
    if (sVar4 <= local_20) {
      CreateAsyncByte(this,'~');
      return;
    }
    if ((bVar1) && (this->mAbortByte == local_20)) break;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (stream,(ulong)local_20);
    UVar2 = *pvVar5;
    if (UVar2 == '}') {
      CreateAsyncByte(this,'}');
      UVar2 = HdlcAnalyzerSettings::Bit5Inv('}');
      CreateAsyncByte(this,UVar2);
    }
    else if (UVar2 == '~') {
      CreateAsyncByte(this,'}');
      UVar2 = HdlcAnalyzerSettings::Bit5Inv('~');
      CreateAsyncByte(this,UVar2);
    }
    else {
      CreateAsyncByte(this,UVar2);
    }
    iVar3 = rand();
    AsyncByteFill(this,iVar3 % 8);
    local_20 = local_20 + 1;
  }
  CreateAsyncByte(this,'}');
  CreateAsyncByte(this,'~');
  AsyncByteFill(this,7);
  this->mAbortByte = this->mAbortByte + 1;
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitByteAsync( const vector<U8>& stream )
{
    // Opening flag
    CreateAsyncByte( HDLC_FLAG_VALUE );

    bool abortFrame = ContainsElement( mFrameNumber );

    for( U32 i = 0; i < stream.size(); ++i )
    {
        bool abortThisByte = ( mAbortByte == i );
        if( abortFrame && abortThisByte ) // Abort the frame: ABORT SEQUENCE = ESCAPE + FLAG
        {
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );
            CreateAsyncByte( HDLC_FLAG_VALUE );
            AsyncByteFill( 7 );
            mAbortByte++;
            return;
        }

        const U8 byte = stream[ i ];
        switch( byte )
        {
        case HDLC_FLAG_VALUE:                                                    // 0x7E
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                            // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_FLAG_VALUE ) ); // 5E
            break;
        case HDLC_ESCAPE_SEQ_VALUE:                                                    // 0x7D
            CreateAsyncByte( HDLC_ESCAPE_SEQ_VALUE );                                  // 7D escape
            CreateAsyncByte( HdlcAnalyzerSettings::Bit5Inv( HDLC_ESCAPE_SEQ_VALUE ) ); // 5D
            break;
        default:
            CreateAsyncByte( byte ); // normal byte
        }

        // Fill between bytes (0 to 7 bits of value 1)
        AsyncByteFill( rand() % 8 );
    }

    // Closing flag
    CreateAsyncByte( HDLC_FLAG_VALUE );
}